

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O2

void __thiscall
diy::RegularDecomposer<diy::Bounds<double>_>::RegularDecomposer
          (RegularDecomposer<diy::Bounds<double>_> *this,int dim_,Bounds *domain_,int nblocks_,
          BoolVector *share_face_,BoolVector *wrap_,CoordinateVector *ghosts_,
          DivisionsVector *divisions_)

{
  DivisionsVector *this_00;
  int iVar1;
  
  this->dim = dim_;
  Bounds<double>::Bounds(&this->domain,domain_);
  this->nblocks = nblocks_;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->share_face,share_face_);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->wrap,wrap_);
  std::vector<double,_std::allocator<double>_>::vector(&this->ghosts,ghosts_);
  this_00 = &this->divisions;
  std::vector<int,_std::allocator<int>_>::vector(this_00,divisions_);
  iVar1 = this->dim;
  if ((int)((*(int *)&(this->share_face).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            *(int *)&(this->share_face).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
           (this->share_face).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) < iVar1) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->share_face,(long)iVar1,false);
    iVar1 = this->dim;
  }
  if ((int)((*(int *)&(this->wrap).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            *(int *)&(this->wrap).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
           (this->wrap).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset) < iVar1) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->wrap,(long)iVar1,false);
    iVar1 = this->dim;
  }
  if ((int)((ulong)((long)(this->ghosts).super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(this->ghosts).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) < iVar1) {
    std::vector<double,_std::allocator<double>_>::resize(&this->ghosts,(long)iVar1);
    iVar1 = this->dim;
  }
  if ((int)((ulong)((long)(this->divisions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->divisions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < iVar1) {
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)iVar1);
  }
  fill_divisions(this,this_00);
  return;
}

Assistant:

RegularDecomposer(int               dim_,
                                      const Bounds&     domain_,
                                      int               nblocks_,
                                      BoolVector        share_face_ = BoolVector(),
                                      BoolVector        wrap_       = BoolVector(),
                                      CoordinateVector  ghosts_     = CoordinateVector(),
                                      DivisionsVector   divisions_  = DivisionsVector()):
                      dim(dim_), domain(domain_), nblocks(nblocks_),
                      share_face(share_face_),
                      wrap(wrap_), ghosts(ghosts_), divisions(divisions_)
    {
      if ((int) share_face.size() < dim)  share_face.resize(dim);
      if ((int) wrap.size() < dim)        wrap.resize(dim);
      if ((int) ghosts.size() < dim)      ghosts.resize(dim);
      if ((int) divisions.size() < dim)   divisions.resize(dim);

      fill_divisions(divisions);
    }